

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte *pbVar1;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string *psVar6;
  FieldEntry *entry;
  undefined8 *puVar7;
  uint *puVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  LogMessageFatal local_40 [16];
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)entry & 3) != 0) {
    AlignFail(entry);
  }
  uVar9 = entry->type_card & 0x30;
  if (uVar9 == 0x20) {
    pcVar2 = MpRepeatedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  uVar10 = entry->type_card & 0x1c0;
  uVar11 = data.field_0._0_4_ & 7;
  if ((ulong)uVar10 == 0xc0) {
    if (uVar11 != 1) {
LAB_0015a0dd:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_0015a192;
    }
  }
  else {
    if (uVar10 == 0x80) {
      psVar6 = (string *)0x0;
    }
    else {
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)uVar10,0x80,
                          "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    }
    if (psVar6 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6c3,*(undefined8 *)(psVar6 + 8),*(undefined8 *)psVar6);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    if (uVar11 != 5) goto LAB_0015a0dd;
  }
  if (uVar9 == 0x30) {
    ChangeOneof(table,entry,data.field_0._0_4_ >> 3,(ParseContext *)msg,msg);
  }
  else if (uVar9 == 0x10) {
    pbVar1 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
    *pbVar1 = *pbVar1 | '\x01' << (entry->has_idx & 7U);
  }
  pvVar3 = MaybeGetSplitBase(msg,true,table);
  puVar7 = (undefined8 *)((ulong)entry->offset + (long)pvVar3);
  if (uVar10 == 0xc0) {
    if (((ulong)puVar7 & 7) != 0) {
      AlignFail();
    }
    *puVar7 = *(undefined8 *)ptr;
    lVar4 = 8;
  }
  else {
    if (((ulong)puVar7 & 3) != 0) goto LAB_0015a215;
    *(undefined4 *)puVar7 = *(undefined4 *)ptr;
    lVar4 = 4;
  }
  ptr = ptr + lVar4;
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar10 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar5 = (ulong)(uVar10 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar5);
LAB_0015a192:
    pcVar2 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar8 & 3) != 0) {
LAB_0015a215:
      AlignFail();
    }
    *puVar8 = *puVar8 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing (wiretype fallback is handled there):
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for mismatched wiretype:
  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint32_t decoded_wiretype = data.tag() & 7;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }
  // Set the field present:
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (card == field_layout::kFcOneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  // Copy the value:
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = UnalignedLoad<uint64_t>(ptr);
    ptr += sizeof(uint64_t);
  } else {
    RefAt<uint32_t>(base, entry.offset) = UnalignedLoad<uint32_t>(ptr);
    ptr += sizeof(uint32_t);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}